

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O2

_ValAtom * __thiscall mbc::Val::Person::attr(Person *this,string *attribute)

{
  bool bVar1;
  undefined8 *puVar2;
  long lStack_20;
  
  bVar1 = std::operator==(attribute,"name");
  if (bVar1) {
    lStack_20 = 0x30;
  }
  else {
    bVar1 = std::operator==(attribute,"sex");
    if (bVar1) {
      lStack_20 = 0x38;
    }
    else {
      bVar1 = std::operator==(attribute,"telephone");
      if (bVar1) {
        lStack_20 = 0x40;
      }
      else {
        bVar1 = std::operator==(attribute,"location");
        if (bVar1) {
          lStack_20 = 0x60;
        }
        else {
          bVar1 = std::operator==(attribute,"mail_number");
          if (bVar1) {
            lStack_20 = 0x48;
          }
          else {
            bVar1 = std::operator==(attribute,"email");
            if (bVar1) {
              lStack_20 = 0x50;
            }
            else {
              bVar1 = std::operator==(attribute,"qq_number");
              if (bVar1) {
                lStack_20 = 0x58;
              }
              else {
                bVar1 = std::operator==(attribute,"classes");
                if (!bVar1) {
                  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar2 = &PTR__exception_0013e8b8;
                  __cxa_throw(puVar2,&bad_attr::typeinfo,std::exception::~exception);
                }
                lStack_20 = 0x68;
              }
            }
          }
        }
      }
    }
  }
  return *(_ValAtom **)((long)&(this->super_ValBase)._vptr_ValBase + lStack_20);
}

Assistant:

_ValAtom* Person::attr(string attribute) {
    if(attribute == "name")             return name_;
    if(attribute == "sex")              return sex_;
    if(attribute == "telephone")        return telephone_;
    if(attribute == "location")         return location_;
    if(attribute == "mail_number")      return mail_number_;
    if(attribute == "email")            return email_;
    if(attribute == "qq_number")        return qq_number_;
    if(attribute == "classes")          return classes_;

    throw bad_attr();
}